

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgenericitemmodel.cpp
# Opt level: O1

QModelIndex * __thiscall
QGenericItemModel::sibling
          (QModelIndex *__return_storage_ptr__,QGenericItemModel *this,int row,int column,
          QModelIndex *index)

{
  undefined8 *puVar1;
  long in_FS_OFFSET;
  int local_30;
  int local_2c;
  QModelIndex *local_28;
  int *piStack_20;
  int *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &local_2c;
  piStack_20 = &local_30;
  puVar1 = *(undefined8 **)(this + 0x10);
  __return_storage_ptr__->r = -0x55555556;
  __return_storage_ptr__->c = -0x55555556;
  *(undefined4 *)&__return_storage_ptr__->i = 0xaaaaaaaa;
  *(undefined4 *)((long)&__return_storage_ptr__->i + 4) = 0xaaaaaaaa;
  (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  __return_storage_ptr__->r = -1;
  __return_storage_ptr__->c = -1;
  __return_storage_ptr__->i = 0;
  (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)0x0;
  local_30 = column;
  local_2c = row;
  local_28 = index;
  (*(code *)*puVar1)(2,puVar1,__return_storage_ptr__);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QModelIndex QGenericItemModel::sibling(int row, int column, const QModelIndex &index) const
{
    return impl->callConst<QModelIndex>(QGenericItemModelImplBase::Sibling, row, column, index);
}